

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::Parser::ParseDefaultAssignment
          (Parser *this,FieldDescriptorProto *field,LocationRecorder *field_location,
          FileDescriptorProto *containing_file)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ErrorCollector *pEVar2;
  ulong uVar3;
  bool bVar4;
  string *output;
  char *pcVar5;
  undefined8 *puVar6;
  protobuf *this_00;
  _Alloc_hider _Var7;
  uint64_t uVar8;
  uint64_t value_1;
  double value;
  LocationRecorder location;
  string local_98;
  uint64 local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  double local_40;
  LocationRecorder local_38;
  
  if (((field->_has_bits_).has_bits_[0] & 8) != 0) {
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_98,"Already set option \"default\".","");
    pEVar2 = this->error_collector_;
    if (pEVar2 != (ErrorCollector *)0x0) {
      (*pEVar2->_vptr_ErrorCollector[2])
                (pEVar2,(ulong)(uint)(this->input_->current_).line,
                 (ulong)(uint)(this->input_->current_).column,&local_98);
    }
    this->had_errors_ = true;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p);
    }
    internal::ArenaStringPtr::ClearToEmpty(&field->default_value_);
    *(byte *)(field->_has_bits_).has_bits_ = (byte)(field->_has_bits_).has_bits_[0] & 0xf7;
  }
  bVar4 = Consume(this,"default");
  if ((!bVar4) || (bVar4 = Consume(this,"="), !bVar4)) {
    return false;
  }
  LocationRecorder::LocationRecorder(&local_38,field_location,7);
  LocationRecorder::RecordLegacyLocation(&local_38,&field->super_Message,DEFAULT_VALUE);
  *(byte *)(field->_has_bits_).has_bits_ = (byte)(field->_has_bits_).has_bits_[0] | 8;
  uVar3 = (field->super_Message).super_MessageLite._internal_metadata_.ptr_;
  puVar6 = (undefined8 *)(uVar3 & 0xfffffffffffffffc);
  if ((uVar3 & 1) != 0) {
    puVar6 = (undefined8 *)*puVar6;
  }
  output = internal::ArenaStringPtr::Mutable_abi_cxx11_(&field->default_value_,puVar6);
  if (((field->_has_bits_).has_bits_[0] & 0x400) == 0) {
    std::__cxx11::string::_M_assign((string *)output);
    bVar4 = true;
    io::Tokenizer::Next(this->input_);
    goto LAB_0033f26b;
  }
  switch(field->type_) {
  case 1:
  case 2:
    bVar4 = TryConsume(this,"-");
    if (bVar4) {
      std::__cxx11::string::append((char *)output);
    }
    this_00 = (protobuf *)&local_40;
    bVar4 = ConsumeNumber(this,(double *)this_00,"Expected number.");
    if (!bVar4) goto LAB_0033f269;
    SimpleDtoa_abi_cxx11_(&local_98,this_00,local_40);
    std::__cxx11::string::_M_append((char *)output,(ulong)local_98._M_dataplus._M_p);
    goto LAB_0033f1f8;
  case 3:
  case 0x10:
  case 0x12:
    uVar8 = 0x7fffffffffffffff;
    goto LAB_0033ef7d;
  case 4:
  case 6:
    uVar8 = 0xffffffffffffffff;
    goto LAB_0033f0e5;
  case 5:
  case 0xf:
  case 0x11:
    uVar8 = 0x7fffffff;
LAB_0033ef7d:
    bVar4 = TryConsume(this,"-");
    if (bVar4) {
      std::__cxx11::string::append((char *)output);
      uVar8 = uVar8 + 1;
    }
    bVar4 = ConsumeInteger64(this,uVar8,&local_68,"Expected integer for field default value.");
    if (!bVar4) {
LAB_0033f269:
      bVar4 = false;
      goto LAB_0033f26b;
    }
    paVar1 = &local_98.field_2;
    local_98._M_dataplus._M_p = (pointer)paVar1;
    pcVar5 = FastUInt64ToBufferLeft(local_68,paVar1->_M_local_buf);
    local_98._M_string_length = (long)pcVar5 - (long)paVar1;
    local_60[0] = &local_50;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_60,local_98._M_dataplus._M_p,
               local_98._M_dataplus._M_p + local_98._M_string_length);
    std::__cxx11::string::_M_append((char *)output,(ulong)local_60[0]);
LAB_0033f1b1:
    _Var7._M_p = (pointer)local_60[0];
    if (local_60[0] == &local_50) break;
    goto LAB_0033f1fd;
  case 7:
  case 0xd:
    uVar8 = 0xffffffff;
LAB_0033f0e5:
    bVar4 = TryConsume(this,"-");
    if (bVar4) {
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_98,"Unsigned field can\'t have negative default value.","");
      pEVar2 = this->error_collector_;
      if (pEVar2 != (ErrorCollector *)0x0) {
        (*pEVar2->_vptr_ErrorCollector[2])
                  (pEVar2,(ulong)(uint)(this->input_->current_).line,
                   (ulong)(uint)(this->input_->current_).column,&local_98);
      }
      this->had_errors_ = true;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p);
      }
    }
    bVar4 = ConsumeInteger64(this,uVar8,&local_68,"Expected integer for field default value.");
    if (bVar4) {
      paVar1 = &local_98.field_2;
      local_98._M_dataplus._M_p = (pointer)paVar1;
      pcVar5 = FastUInt64ToBufferLeft(local_68,paVar1->_M_local_buf);
      local_98._M_string_length = (long)pcVar5 - (long)paVar1;
      local_60[0] = &local_50;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_60,local_98._M_dataplus._M_p,
                 local_98._M_dataplus._M_p + local_98._M_string_length);
      std::__cxx11::string::_M_append((char *)output,(ulong)local_60[0]);
      goto LAB_0033f1b1;
    }
    goto LAB_0033f269;
  case 8:
    bVar4 = TryConsume(this,"true");
    if ((!bVar4) && (bVar4 = TryConsume(this,"false"), !bVar4)) {
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_98,"Expected \"true\" or \"false\".","");
      pEVar2 = this->error_collector_;
      if (pEVar2 != (ErrorCollector *)0x0) {
        (*pEVar2->_vptr_ErrorCollector[2])
                  (pEVar2,(ulong)(uint)(this->input_->current_).line,
                   (ulong)(uint)(this->input_->current_).column,&local_98);
      }
      goto LAB_0033f059;
    }
    std::__cxx11::string::assign((char *)output);
    break;
  case 9:
    bVar4 = ConsumeString(this,output,"Expected string for field default value.");
    goto LAB_0033f265;
  case 10:
  case 0xb:
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_98,"Messages can\'t have default values.","");
    pEVar2 = this->error_collector_;
    if (pEVar2 != (ErrorCollector *)0x0) {
      (*pEVar2->_vptr_ErrorCollector[2])
                (pEVar2,(ulong)(uint)(this->input_->current_).line,
                 (ulong)(uint)(this->input_->current_).column,&local_98);
    }
LAB_0033f059:
    this->had_errors_ = true;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p);
    }
    goto LAB_0033f269;
  case 0xc:
    bVar4 = ConsumeString(this,output,"Expected string.");
    if (!bVar4) goto LAB_0033f269;
    CEscape(&local_98,output);
    std::__cxx11::string::operator=((string *)output,(string *)&local_98);
LAB_0033f1f8:
    _Var7._M_p = local_98._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
LAB_0033f1fd:
      operator_delete(_Var7._M_p);
    }
    break;
  case 0xe:
    bVar4 = ConsumeIdentifier(this,output,"Expected enum identifier for field default value.");
LAB_0033f265:
    if (bVar4 != false) break;
    goto LAB_0033f269;
  }
  bVar4 = true;
LAB_0033f26b:
  LocationRecorder::~LocationRecorder(&local_38);
  return bVar4;
}

Assistant:

bool Parser::ParseDefaultAssignment(
    FieldDescriptorProto* field, const LocationRecorder& field_location,
    const FileDescriptorProto* containing_file) {
  if (field->has_default_value()) {
    AddError("Already set option \"default\".");
    field->clear_default_value();
  }

  DO(Consume("default"));
  DO(Consume("="));

  LocationRecorder location(field_location,
                            FieldDescriptorProto::kDefaultValueFieldNumber);
  location.RecordLegacyLocation(field,
                                DescriptorPool::ErrorCollector::DEFAULT_VALUE);
  std::string* default_value = field->mutable_default_value();

  if (!field->has_type()) {
    // The field has a type name, but we don't know if it is a message or an
    // enum yet. (If it were a primitive type, |field| would have a type set
    // already.) In this case, simply take the current string as the default
    // value; we will catch the error later if it is not a valid enum value.
    // (N.B. that we do not check whether the current token is an identifier:
    // doing so throws strange errors when the user mistypes a primitive
    // typename and we assume it's an enum. E.g.: "optional int foo = 1 [default
    // = 42]". In such a case the fundamental error is really that "int" is not
    // a type, not that "42" is not an identifier. See b/12533582.)
    *default_value = input_->current().text;
    input_->Next();
    return true;
  }

  switch (field->type()) {
    case FieldDescriptorProto::TYPE_INT32:
    case FieldDescriptorProto::TYPE_INT64:
    case FieldDescriptorProto::TYPE_SINT32:
    case FieldDescriptorProto::TYPE_SINT64:
    case FieldDescriptorProto::TYPE_SFIXED32:
    case FieldDescriptorProto::TYPE_SFIXED64: {
      uint64_t max_value = std::numeric_limits<int64_t>::max();
      if (field->type() == FieldDescriptorProto::TYPE_INT32 ||
          field->type() == FieldDescriptorProto::TYPE_SINT32 ||
          field->type() == FieldDescriptorProto::TYPE_SFIXED32) {
        max_value = std::numeric_limits<int32_t>::max();
      }

      // These types can be negative.
      if (TryConsume("-")) {
        default_value->append("-");
        // Two's complement always has one more negative value than positive.
        ++max_value;
      }
      // Parse the integer to verify that it is not out-of-range.
      uint64_t value;
      DO(ConsumeInteger64(max_value, &value,
                          "Expected integer for field default value."));
      // And stringify it again.
      default_value->append(StrCat(value));
      break;
    }

    case FieldDescriptorProto::TYPE_UINT32:
    case FieldDescriptorProto::TYPE_UINT64:
    case FieldDescriptorProto::TYPE_FIXED32:
    case FieldDescriptorProto::TYPE_FIXED64: {
      uint64_t max_value = std::numeric_limits<uint64_t>::max();
      if (field->type() == FieldDescriptorProto::TYPE_UINT32 ||
          field->type() == FieldDescriptorProto::TYPE_FIXED32) {
        max_value = std::numeric_limits<uint32_t>::max();
      }

      // Numeric, not negative.
      if (TryConsume("-")) {
        AddError("Unsigned field can't have negative default value.");
      }
      // Parse the integer to verify that it is not out-of-range.
      uint64_t value;
      DO(ConsumeInteger64(max_value, &value,
                          "Expected integer for field default value."));
      // And stringify it again.
      default_value->append(StrCat(value));
      break;
    }

    case FieldDescriptorProto::TYPE_FLOAT:
    case FieldDescriptorProto::TYPE_DOUBLE:
      // These types can be negative.
      if (TryConsume("-")) {
        default_value->append("-");
      }
      // Parse the integer because we have to convert hex integers to decimal
      // floats.
      double value;
      DO(ConsumeNumber(&value, "Expected number."));
      // And stringify it again.
      default_value->append(SimpleDtoa(value));
      break;

    case FieldDescriptorProto::TYPE_BOOL:
      if (TryConsume("true")) {
        default_value->assign("true");
      } else if (TryConsume("false")) {
        default_value->assign("false");
      } else {
        AddError("Expected \"true\" or \"false\".");
        return false;
      }
      break;

    case FieldDescriptorProto::TYPE_STRING:
      // Note: When file option java_string_check_utf8 is true, if a
      // non-string representation (eg byte[]) is later supported, it must
      // be checked for UTF-8-ness.
      DO(ConsumeString(default_value,
                       "Expected string for field default "
                       "value."));
      break;

    case FieldDescriptorProto::TYPE_BYTES:
      DO(ConsumeString(default_value, "Expected string."));
      *default_value = CEscape(*default_value);
      break;

    case FieldDescriptorProto::TYPE_ENUM:
      DO(ConsumeIdentifier(default_value,
                           "Expected enum identifier for field "
                           "default value."));
      break;

    case FieldDescriptorProto::TYPE_MESSAGE:
    case FieldDescriptorProto::TYPE_GROUP:
      AddError("Messages can't have default values.");
      return false;
  }

  return true;
}